

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RCStrUnref(void *z)

{
  int iVar1;
  _func_void_sqlite3_mutex_ptr **pp_Var2;
  sqlite3_mutex *psVar3;
  
  psVar3 = (sqlite3_mutex *)((long)z + -8);
  if (1 < *(ulong *)((long)z + -8)) {
    (psVar3->mutex).__align = *(ulong *)((long)z + -8) - 1;
    return;
  }
  if (psVar3 == (sqlite3_mutex *)0x0) {
    return;
  }
  if (sqlite3Config.bMemstat == 0) {
    pp_Var2 = (_func_void_sqlite3_mutex_ptr **)&sqlite3Config.m.xFree;
  }
  else {
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
    }
    iVar1 = (*sqlite3Config.m.xSize)(psVar3);
    sqlite3Stat.nowValue[0] = sqlite3Stat.nowValue[0] - iVar1;
    sqlite3Stat.nowValue[9] = sqlite3Stat.nowValue[9] + -1;
    (*sqlite3Config.m.xFree)(psVar3);
    if (mem0.mutex == (sqlite3_mutex *)0x0) {
      return;
    }
    pp_Var2 = &sqlite3Config.mutex.xMutexLeave;
    psVar3 = mem0.mutex;
  }
  (**pp_Var2)(psVar3);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RCStrUnref(void *z){
  RCStr *p = (RCStr*)z;
  assert( p!=0 );
  p--;
  assert( p->nRCRef>0 );
  if( p->nRCRef>=2 ){
    p->nRCRef--;
  }else{
    sqlite3_free(p);
  }
}